

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

int http_set_header2(http_s *r,fio_str_info_s n,fio_str_info_s v)

{
  FIOBJ name;
  FIOBJ value;
  int ret;
  FIOBJ tmp;
  http_s *r_local;
  
  if ((((r == (http_s *)0x0) || (((r->method == 0 && (r->status_str == 0)) && (r->status != 0)))) ||
      ((n.data == (char *)0x0 || (n.len == 0)))) || ((v.data != (char *)0x0 && (v.len == 0)))) {
    r_local._4_4_ = -1;
  }
  else {
    name = fiobj_str_new(n.data,n.len);
    value = fiobj_str_new(v.data,v.len);
    r_local._4_4_ = http_set_header(r,name,value);
    fiobj_free(name);
  }
  return r_local._4_4_;
}

Assistant:

int http_set_header2(http_s *r, fio_str_info_s n, fio_str_info_s v) {
  if (HTTP_INVALID_HANDLE(r) || !n.data || !n.len || (v.data && !v.len))
    return -1;
  FIOBJ tmp = fiobj_str_new(n.data, n.len);
  int ret = http_set_header(r, tmp, fiobj_str_new(v.data, v.len));
  fiobj_free(tmp);
  return ret;
}